

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_GetPolySpots(MapData *map,TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots,
                   TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors)

{
  double *pdVar1;
  short sVar2;
  uint uVar3;
  long *plVar4;
  FPolyStart *pFVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  ulong uVar9;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *this;
  
  if (MapThingsConverted.Count != 0) {
    lVar8 = 0x28;
    uVar9 = 0;
    do {
      plVar4 = *(long **)((long)(MapThingsConverted.Array)->args + lVar8 + -0x38);
      if (((plVar4 != (long *)0x0) && (*plVar4 == 0)) &&
         (sVar2 = (short)(int)plVar4[1], (ushort)(sVar2 - 0xbU) < 4)) {
        this = anchors;
        if (sVar2 != 0xb) {
          this = spots;
        }
        sVar2 = *(short *)((long)(MapThingsConverted.Array)->args + lVar8 + -0x40);
        pdVar1 = (double *)((long)(MapThingsConverted.Array)->args + lVar8 + -0x58);
        dVar6 = *pdVar1;
        dVar7 = pdVar1[1];
        TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::Grow(this,1);
        pFVar5 = this->Array;
        uVar3 = this->Count;
        pFVar5[uVar3].polynum = (int)sVar2;
        pFVar5 = pFVar5 + uVar3;
        pFVar5->x = SUB84(dVar6 + 103079215104.0,0);
        pFVar5->y = SUB84(dVar7 + 103079215104.0,0);
        this->Count = this->Count + 1;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x90;
    } while (uVar9 < MapThingsConverted.Count);
  }
  return;
}

Assistant:

void P_GetPolySpots (MapData * map, TArray<FNodeBuilder::FPolyStart> &spots, TArray<FNodeBuilder::FPolyStart> &anchors)
{
	//if (map->HasBehavior)
	{
		for (unsigned int i = 0; i < MapThingsConverted.Size(); ++i)
		{
			FDoomEdEntry *mentry = MapThingsConverted[i].info;
			if (mentry != NULL && mentry->Type == NULL && mentry->Special >= SMT_PolyAnchor && mentry->Special <= SMT_PolySpawnHurt)
			{
				FNodeBuilder::FPolyStart newvert;
				newvert.x = FLOAT2FIXED(MapThingsConverted[i].pos.X);
				newvert.y = FLOAT2FIXED(MapThingsConverted[i].pos.Y);
				newvert.polynum = MapThingsConverted[i].angle;
				if (mentry->Special == SMT_PolyAnchor)
				{
					anchors.Push (newvert);
				}
				else
				{
					spots.Push (newvert);
				}
			}
		}
	}
}